

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_base.h
# Opt level: O1

void __thiscall
draco::EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::SetEncodingMethod
          (EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_> *this,
          int encoding_method)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"encoding_method","");
  Options::SetInt((Options *)&this->options_,&local_40,encoding_method);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SetEncodingMethod(int encoding_method) {
    options_.SetGlobalInt("encoding_method", encoding_method);
  }